

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.h
# Opt level: O0

void __thiscall
Catch::TestSpecParser::TestSpecParser(TestSpecParser *this,ITagAliasRegistry *tagAliases)

{
  ITagAliasRegistry *tagAliases_local;
  TestSpecParser *this_local;
  
  this->m_mode = None;
  this->lastMode = None;
  this->m_exclusion = false;
  this->m_pos = 0;
  this->m_realPatternPos = 0;
  std::__cxx11::string::string((string *)&this->m_arg);
  std::__cxx11::string::string((string *)&this->m_substring);
  std::__cxx11::string::string((string *)&this->m_patternName);
  clara::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&this->m_escapeChars);
  TestSpec::Filter::Filter(&this->m_currentFilter);
  TestSpec::TestSpec(&this->m_testSpec);
  this->m_tagAliases = tagAliases;
  return;
}

Assistant:

TestSpecParser::TestSpecParser( ITagAliasRegistry const& tagAliases ) : m_tagAliases( &tagAliases ) {}